

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  add_layer<_9dce10a9_> *this;
  int iVar1;
  undefined8 uVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  ostream *poVar6;
  long lVar7;
  tensor *ptVar8;
  long *plVar9;
  char *pcVar10;
  rgb_pixel *__s;
  ulong __n;
  ulong rows;
  rgb_pixel *prVar11;
  float fVar12;
  undefined1 auVar13 [16];
  sstack<dlib::sgd> solvers_00;
  sstack<dlib::sgd> solvers_01;
  undefined1 auVar14 [12];
  vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
  minibatch;
  size_t num_parameters;
  vector<dlib::sgd,_std::allocator<dlib::sgd>_> solvers;
  vector<unsigned_long,_std::allocator<unsigned_long>_> labels;
  matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  image;
  array<float,_100UL> times;
  vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
  local_740;
  undefined1 local_728 [16];
  long local_718;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_708;
  matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  local_6f0;
  undefined1 local_6d0 [40];
  _func_void_void_ptr *local_6a8;
  _func_void_ptr_void_ptr *p_Stack_6a0;
  undefined4 local_698;
  element_type *local_690;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_688;
  undefined4 uStack_680;
  undefined4 uStack_67c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_678;
  element_type *peStack_670;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_668;
  int iStack_660;
  storage_heap local_658;
  undefined1 local_638 [40];
  longlong local_610;
  size_t sStack_608;
  undefined4 local_600;
  element_type *local_5f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_5f0;
  undefined4 uStack_5e8;
  undefined4 uStack_5e4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_5e0;
  element_type *peStack_5d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5d0;
  int iStack_5c8;
  storage_heap local_5c0;
  undefined8 local_5a0;
  undefined1 local_4a8 [1032];
  longlong local_a0;
  size_t sStack_98;
  undefined4 local_90;
  element_type *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  element_type *peStack_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  int iStack_58;
  storage_heap local_50;
  
  setenv("CUDA_LAUNCH_BLOCKING","1",1);
  rows = 0xe0;
  __n = 1;
  if (argc < 2) goto LAB_00105a92;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_4a8,argv[1],(allocator<char> *)local_6d0);
  uVar2 = local_4a8._0_8_;
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  *piVar3 = 0;
  __n = strtoul((char *)uVar2,(char **)local_638,10);
  if (local_638._0_8_ == uVar2) {
    std::__throw_invalid_argument("stoul");
    goto LAB_00106506;
  }
  if (*piVar3 == 0) {
LAB_001059d4:
    *piVar3 = iVar1;
  }
  else if (*piVar3 == 0x22) {
    std::__throw_out_of_range("stoul");
    goto LAB_001059d4;
  }
  if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
    operator_delete((void *)local_4a8._0_8_,local_4a8._16_8_ + 1);
  }
  if (argc == 2) goto LAB_00105a92;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_4a8,argv[2],(allocator<char> *)local_6d0);
  uVar2 = local_4a8._0_8_;
  iVar1 = *piVar3;
  *piVar3 = 0;
  rows = strtoul((char *)local_4a8._0_8_,(char **)local_638,10);
  if (local_638._0_8_ == uVar2) {
LAB_00106506:
    auVar14 = std::__throw_invalid_argument("stoul");
    if (auVar14._8_4_ == 1) {
      plVar9 = (long *)__cxa_begin_catch(auVar14._0_8_);
      pcVar10 = (char *)(**(code **)(*plVar9 + 0x10))(plVar9);
      poVar6 = std::operator<<((ostream *)&std::cout,pcVar10);
      std::endl<char,std::char_traits<char>>(poVar6);
      __cxa_end_catch();
      return 1;
    }
    _Unwind_Resume(auVar14._0_8_);
  }
  if (*piVar3 == 0) {
LAB_00105a6d:
    *piVar3 = iVar1;
  }
  else if (*piVar3 == 0x22) {
    std::__throw_out_of_range("stoul");
    goto LAB_00105a6d;
  }
  if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
    operator_delete((void *)local_4a8._0_8_,local_4a8._16_8_ + 1);
  }
LAB_00105a92:
  dlib::
  matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  ::matrix(&local_6f0,rows,rows);
  __s = (rgb_pixel *)local_6f0.data.nr_;
  if ((rgb_pixel *)local_6f0.data.nr_ != (rgb_pixel *)0x0) {
    __s = local_6f0.data.data;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6f0.data.nc_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __s = (rgb_pixel *)0x0;
  }
  if (0 < local_6f0.data.nr_) {
    prVar11 = (rgb_pixel *)local_6f0.data.nr_;
    do {
      if (0 < local_6f0.data.nc_) {
        memset(__s,0,local_6f0.data.nc_ * 3);
      }
      __s = __s + local_6f0.data.nc_;
      prVar11 = (rgb_pixel *)&prVar11[-1].blue;
    } while (prVar11 != (rgb_pixel *)0x0);
  }
  std::
  vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
  ::vector(&local_740,__n,&local_6f0,(allocator_type *)local_4a8);
  auVar13 = ZEXT816(0) << 0x40;
  local_6d0._8_32_ = ZEXT1632(auVar13);
  local_6a8 = (_func_void_void_ptr *)0x0;
  p_Stack_6a0 = (_func_void_ptr_void_ptr *)0x0;
  local_6d0._0_8_ = &PTR__resizable_tensor_001fa340;
  local_698._0_1_ = true;
  local_698._1_1_ = true;
  local_698._2_1_ = false;
  local_698._3_1_ = false;
  local_690 = (element_type *)0x0;
  _Stack_688._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uStack_680 = 0;
  local_658 = (storage_heap)ZEXT1632(auVar13);
  uStack_67c = 0;
  _Stack_678._M_pi = auVar13._4_8_;
  peStack_670 = (element_type *)0x0;
  local_668._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iStack_660 = 0;
  lVar4 = std::chrono::_V2::steady_clock::now();
  dlib::add_layer<$556ce9e5$>::add_layer((add_layer<_556ce9e5_> *)(local_4a8 + 8));
  auVar13 = ZEXT816(0) << 0x40;
  local_4a8._1000_32_ = ZEXT1632(auVar13);
  local_a0 = 0;
  sStack_98 = 0;
  local_4a8._992_8_ = &PTR__resizable_tensor_001fa340;
  local_90._0_1_ = true;
  local_90._1_1_ = true;
  local_90._2_1_ = false;
  local_90._3_1_ = false;
  local_88 = (element_type *)0x0;
  _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uStack_78 = 0;
  local_50 = (storage_heap)ZEXT1632(auVar13);
  uStack_74 = 0;
  _Stack_70._M_pi = auVar13._4_8_;
  peStack_68 = (element_type *)0x0;
  local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iStack_58 = 0;
  lVar5 = std::chrono::_V2::steady_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"instantiation time: ",0x14);
  poVar6 = std::ostream::_M_insert<double>((double)((float)(lVar5 - lVar4) / 1e+06));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ms",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::istream::get();
  dlib::repeat<$fcef677a$>::
  to_tensor<__gnu_cxx::__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
            ((((unique_ptr<_5ffbb522_> *)(local_4a8._360_8_ + 0xc0))->_M_t).
             super___uniq_ptr_impl<_5ffbb522_>._M_t.super__Tuple_impl<_812eb1f5_>.
             super__Head_base<_d2e78f86_>._M_head_impl,
             (__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
              )local_740.
               super__Vector_base<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
              )local_740.
               super__Vector_base<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,(resizable_tensor *)local_6d0);
  lVar4 = std::chrono::_V2::steady_clock::now();
  dlib::add_layer<$556ce9e5$>::forward((add_layer<_556ce9e5_> *)(local_4a8 + 8),(tensor *)local_6d0)
  ;
  lVar5 = std::chrono::_V2::steady_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"1st inference time: ",0x14);
  poVar6 = std::ostream::_M_insert<double>((double)((float)(lVar5 - lVar4) / 1e+06));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ms",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"input shape: ",0xd);
  poVar6 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
  local_638[0] = (allocator_type)0x78;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_638,1);
  poVar6 = std::ostream::_M_insert<long_long>((longlong)poVar6);
  local_638[0] = (allocator_type)0x78;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_638,1);
  poVar6 = std::ostream::_M_insert<long_long>((longlong)poVar6);
  local_638[0] = (allocator_type)0x78;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_638,1);
  poVar6 = std::ostream::_M_insert<long_long>((longlong)poVar6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"parameters: ",0xc);
  local_728._8_8_ = local_728;
  local_638._0_8_ = (_func_int **)0x0;
  local_728._0_8_ = (_func_int **)0x0;
  local_638._8_8_ = local_728 + 8;
  local_708.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_638;
  dlib::impl::vl_loop<1UL,_193UL>::visit<_8e5f7eb3_>
            ((add_loss_layer<_e8a4ea05_> *)local_4a8,
             (visitor_computational_layer<dlib::impl::visit_layer_parameters<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_arrufat[P]dlib_pytorch_benchmark_external_dlib_dlib____dlib_dnn_visitors_h:189:37)>_>
              *)&local_708);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::istream::get();
  lVar4 = 0;
  do {
    dlib::repeat<$fcef677a$>::
    to_tensor<__gnu_cxx::__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
              ((((unique_ptr<_5ffbb522_> *)(local_4a8._360_8_ + 0xc0))->_M_t).
               super___uniq_ptr_impl<_5ffbb522_>._M_t.super__Tuple_impl<_812eb1f5_>.
               super__Head_base<_d2e78f86_>._M_head_impl,
               (__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                )local_740.
                 super__Vector_base<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                )local_740.
                 super__Vector_base<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(resizable_tensor *)local_6d0);
    lVar5 = std::chrono::_V2::steady_clock::now();
    dlib::add_layer<$556ce9e5$>::forward
              ((add_layer<_556ce9e5_> *)(local_4a8 + 8),(tensor *)local_6d0);
    lVar7 = std::chrono::_V2::steady_clock::now();
    fVar12 = (float)(lVar7 - lVar5) / 1e+06;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"2nd inference time: ",0x14);
    poVar6 = std::ostream::_M_insert<double>((double)fVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ms   \r",7);
    std::ostream::flush();
    *(float *)(local_638 + lVar4) = fVar12;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 400);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\navg: ",6);
  lVar4 = std::cout;
  fVar12 = 0.0;
  *(uint *)(std::chrono::_V2::steady_clock::now + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::chrono::_V2::steady_clock::now + *(long *)(std::cout + -0x18)) & 0xfffffefb |
       4;
  *(undefined8 *)(operator_delete__ + *(long *)(lVar4 + -0x18)) = 3;
  lVar4 = 0;
  do {
    fVar12 = fVar12 + *(float *)(local_638 + lVar4);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 400);
  poVar6 = std::ostream::_M_insert<double>((double)(fVar12 / 100.0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ms",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::istream::get();
  dlib::resizable_tensor::clear((resizable_tensor *)(local_4a8 + 0x3e0));
  dlib::add_layer<$556ce9e5$>::clean((add_layer<_556ce9e5_> *)(local_4a8 + 8));
  local_4a8._992_8_ = &PTR__resizable_tensor_001fa340;
  if (local_50.ptr != (void *)0x0) {
    (*local_50.del)(local_50.ptr);
  }
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
  }
  if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
  }
  if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_80._M_pi);
  }
  dlib::add_layer<$556ce9e5$>::~add_layer((add_layer<_556ce9e5_> *)(local_4a8 + 8));
  local_4a8._0_8_ = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_708,__n,(value_type_conflict2 *)local_4a8,(allocator_type *)local_638);
  this = (add_layer<_9dce10a9_> *)(local_4a8 + 8);
  dlib::add_layer<$9dce10a9$>::add_layer(this);
  auVar13 = ZEXT816(0) << 0x40;
  local_a0 = 0;
  sStack_98 = 0;
  local_610 = 0;
  sStack_608 = 0;
  local_4a8._1000_32_ = ZEXT1632(auVar13);
  local_4a8._992_8_ = &PTR__resizable_tensor_001fa340;
  local_90._0_1_ = true;
  local_90._1_1_ = true;
  local_90._2_1_ = false;
  local_90._3_1_ = false;
  local_5f8 = (element_type *)0x0;
  _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uStack_78 = 0;
  local_638._8_32_ = ZEXT1632(auVar13);
  uStack_5e4 = 0;
  _Stack_70._M_pi = auVar13._4_8_;
  peStack_68 = (element_type *)0x0;
  local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iStack_58 = 0;
  local_638._0_8_ = &PTR__resizable_tensor_001fa340;
  local_600._0_1_ = true;
  local_600._1_1_ = true;
  local_600._2_1_ = false;
  local_600._3_1_ = false;
  uStack_5e8 = 0;
  peStack_5d8 = (element_type *)0x0;
  local_5d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iStack_5c8 = 0;
  local_5c0 = (storage_heap)ZEXT1632(auVar13);
  local_5a0._0_4_ = 0.0005;
  local_5a0._4_4_ = 0.9;
  _Stack_5f0._M_pi = _Stack_80._M_pi;
  _Stack_5e0._M_pi = _Stack_70._M_pi;
  local_88 = local_5f8;
  uStack_74 = uStack_5e4;
  local_50 = local_5c0;
  std::vector<dlib::sgd,_std::allocator<dlib::sgd>_>::vector
            ((vector<dlib::sgd,_std::allocator<dlib::sgd>_> *)(local_728 + 8),0xa9,
             (value_type *)local_638,(allocator_type *)local_728);
  local_638._0_8_ = &PTR__resizable_tensor_001fa340;
  if (local_5c0.ptr != (void *)0x0) {
    (*local_5c0.del)(local_5c0.ptr);
  }
  if (local_5d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5d0._M_pi);
  }
  if (_Stack_5e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_5e0._M_pi);
  }
  if (_Stack_5f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_5f0._M_pi);
  }
  dlib::repeat<$a6f43afe$>::
  to_tensor<__gnu_cxx::__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
            ((repeat<_a6f43afe_> *)
             (((unique_ptr<_5ffbb522_> *)(local_4a8._360_8_ + 0xc0))->_M_t).
             super___uniq_ptr_impl<_5ffbb522_>._M_t.super__Tuple_impl<_812eb1f5_>.
             super__Head_base<_d2e78f86_>._M_head_impl,
             (__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
              )local_740.
               super__Vector_base<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
              )local_740.
               super__Vector_base<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,(resizable_tensor *)local_6d0);
  dlib::add_loss_layer<$f418249$>::
  compute_loss<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ((add_loss_layer<_f418249_> *)local_4a8,(tensor *)local_6d0,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_708.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start);
  ptVar8 = dlib::add_layer<$9dce10a9$>::private_get_gradient_input(this);
  dlib::add_layer<$9dce10a9$>::back_propagate_error(this,(tensor *)local_6d0,ptVar8,yes);
  solvers_00.mysize = (local_718 - local_728._8_8_ >> 5) * -0x3333333333333333;
  solvers_00.data = (sgd *)local_728._8_8_;
  dlib::add_layer<$9dce10a9$>::update_parameters<dlib::sgd>(this,solvers_00,0.1);
  lVar4 = 0;
  do {
    lVar5 = std::chrono::_V2::steady_clock::now();
    dlib::repeat<$a6f43afe$>::
    to_tensor<__gnu_cxx::__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
              ((repeat<_a6f43afe_> *)
               (((unique_ptr<_5ffbb522_> *)(local_4a8._360_8_ + 0xc0))->_M_t).
               super___uniq_ptr_impl<_5ffbb522_>._M_t.super__Tuple_impl<_812eb1f5_>.
               super__Head_base<_d2e78f86_>._M_head_impl,
               (__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                )local_740.
                 super__Vector_base<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                )local_740.
                 super__Vector_base<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(resizable_tensor *)local_6d0);
    dlib::add_loss_layer<$f418249$>::
    compute_loss<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ((add_loss_layer<_f418249_> *)local_4a8,(tensor *)local_6d0,
               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )local_708.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start);
    ptVar8 = dlib::add_layer<$9dce10a9$>::private_get_gradient_input(this);
    dlib::add_layer<$9dce10a9$>::back_propagate_error(this,(tensor *)local_6d0,ptVar8,yes);
    solvers_01.mysize = (local_718 - local_728._8_8_ >> 5) * -0x3333333333333333;
    solvers_01.data = (sgd *)local_728._8_8_;
    dlib::add_layer<$9dce10a9$>::update_parameters<dlib::sgd>(this,solvers_01,0.1);
    lVar7 = std::chrono::_V2::steady_clock::now();
    fVar12 = (float)(lVar7 - lVar5) / 1e+06;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"backward pass time: ",0x14);
    poVar6 = std::ostream::_M_insert<double>((double)fVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ms   \r",7);
    std::ostream::flush();
    *(float *)(local_638 + lVar4) = fVar12;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 400);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\navg: ",6);
  lVar4 = std::cout;
  fVar12 = 0.0;
  *(uint *)(std::chrono::_V2::steady_clock::now + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::chrono::_V2::steady_clock::now + *(long *)(std::cout + -0x18)) & 0xfffffefb |
       4;
  *(undefined8 *)(operator_delete__ + *(long *)(lVar4 + -0x18)) = 3;
  lVar4 = 0;
  do {
    fVar12 = fVar12 + *(float *)(local_638 + lVar4);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 400);
  poVar6 = std::ostream::_M_insert<double>((double)(fVar12 / 100.0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ms",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::istream::get();
  std::vector<dlib::sgd,_std::allocator<dlib::sgd>_>::~vector
            ((vector<dlib::sgd,_std::allocator<dlib::sgd>_> *)(local_728 + 8));
  local_4a8._992_8_ = &PTR__resizable_tensor_001fa340;
  if (local_50.ptr != (void *)0x0) {
    (*local_50.del)(local_50.ptr);
  }
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
  }
  if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
  }
  if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_80._M_pi);
  }
  dlib::add_layer<$9dce10a9$>::~add_layer(this);
  if (local_708.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_708.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_708.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_708.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_6d0._0_8_ = &PTR__resizable_tensor_001fa340;
  if (local_658.ptr != (void *)0x0) {
    (*local_658.del)(local_658.ptr);
  }
  if (local_668._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_668._M_pi);
  }
  if (_Stack_678._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_678._M_pi);
  }
  if (_Stack_688._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_688._M_pi);
  }
  std::
  vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
  ::~vector(&local_740);
  if (local_6f0.data.data != (rgb_pixel *)0x0) {
    operator_delete__(local_6f0.data.data);
  }
  return 0;
}

Assistant:

int main(const int argc, const char** argv)try
{
    setenv("CUDA_LAUNCH_BLOCKING", "1", 1);
    chrono::time_point<chrono::steady_clock> t0, t1;
    float duration{};

    size_t mini_batch_size = 1;
    size_t image_size = 224;
    if (argc > 1)
    {
        mini_batch_size = std::stoul(argv[1]);
    }
    if (argc > 2)
    {
        image_size = std::stoul(argv[2]);
    }

    // Create the images to test
    dlib::matrix<dlib::rgb_pixel> image(image_size, image_size);
    dlib::assign_all_pixels(image, dlib::rgb_pixel(0, 0, 0));
    const std::vector<dlib::matrix<dlib::rgb_pixel>> minibatch(mini_batch_size, image);

    // The input tensor of the network
    dlib::resizable_tensor x;

    {
        // Declare the network
        t0 = chrono::steady_clock::now();
        resnet::infer_50 net;
        t1 = chrono::steady_clock::now();
        duration = chrono::duration_cast<fms>(t1 - t0).count();
        std::cout << "instantiation time: " << duration << " ms" << std::endl;
        std::cin.get();

        // Convert them to a tensor for this network. This way we only measure inference and not
        // data transfer. In PyTorch, this would be: x = x.cuda()
        net.to_tensor(minibatch.begin(), minibatch.end(), x);
        t0 = chrono::steady_clock::now();
        net.forward(x);
        t1 = chrono::steady_clock::now();
        duration = chrono::duration_cast<fms>(t1 - t0).count();
        std::cout << "1st inference time: " << duration << " ms" << std::endl;
        std::cout << "input shape: " << x.num_samples() << 'x' << x.k() << 'x' << x.nr() << 'x'
                  << x.nc() << std::endl;
        std::cout << "parameters: " << dlib::count_parameters(net) << std::endl;
        std::cin.get();

        std::array<float, 100> times;
        for (auto& time : times)
        {
            net.to_tensor(minibatch.begin(), minibatch.end(), x);
            t0 = chrono::steady_clock::now();
            net.forward(x);
            t1 = chrono::steady_clock::now();
            duration = chrono::duration_cast<fms>(t1 - t0).count();
            std::cout << "2nd inference time: " << duration << " ms   \r" << std::flush;
            time = duration;
        }
        std::cout << "\navg: " << std::fixed << std::setprecision(3)
                  << std::accumulate(times.begin(), times.end(), 0.f, std::plus<float>()) /
                         times.size()
                  << " ms" << std::endl;
        std::cin.get();
        net.clean();
    }

    // Create some labels
    const std::vector<unsigned long> labels(mini_batch_size, 0);
    resnet::train_50 net;
    // measure backward pass
    std::vector<dlib::sgd> solvers(net.num_computational_layers, dlib::sgd(0.0005, 0.9));
    net.to_tensor(minibatch.begin(), minibatch.end(), x);
    net.compute_loss(x, labels.begin());
    net.back_propagate_error(x);
    net.update_parameters(solvers, 0.1);
    std::array<float, 100> times;
    for (auto& time : times)
    {
        t0 = chrono::steady_clock::now();
        net.to_tensor(minibatch.begin(), minibatch.end(), x);
        net.compute_loss(x, labels.begin());
        net.back_propagate_error(x);
        net.update_parameters(solvers, 0.1);
        t1 = chrono::steady_clock::now();
        duration = chrono::duration_cast<fms>(t1 - t0).count();
        std::cout << "backward pass time: " << duration << " ms   \r" << std::flush;
        time = duration;
    }
    std::cout << "\navg: " << std::fixed << std::setprecision(3)
              << std::accumulate(times.begin(), times.end(), 0.f, std::plus<float>()) /
                     times.size()
              << " ms" << std::endl;
    std::cin.get();

    return EXIT_SUCCESS;
}
catch (const std::exception& e)
{
    std::cout << e.what() << std::endl;
    return EXIT_FAILURE;
}